

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

OptionStatus
setLocalOptionValue(HighsLogOptions *report_log_options,OptionRecordString *option,string *value)

{
  OptionStatus OVar1;
  string sStack_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)value);
  OVar1 = checkOptionValue(report_log_options,option,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (OVar1 == kOk) {
    std::__cxx11::string::string((string *)&sStack_68,(string *)value);
    OptionRecordString::assignvalue(option,&sStack_68);
    std::__cxx11::string::~string((string *)&sStack_68);
  }
  return OVar1;
}

Assistant:

OptionStatus setLocalOptionValue(const HighsLogOptions& report_log_options,
                                 OptionRecordString& option,
                                 const std::string value) {
  OptionStatus return_status =
      checkOptionValue(report_log_options, option, value);
  if (return_status != OptionStatus::kOk) return return_status;
  option.assignvalue(value);
  return OptionStatus::kOk;
}